

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int userauth_publickey_fromfile
              (LIBSSH2_SESSION *session,char *username,size_t username_len,char *publickey,
              char *privatekey,char *passphrase)

{
  int iVar1;
  void **ppvStack_68;
  int rc;
  void *abstract;
  privkey_file privkey_file;
  size_t pubkeydata_len;
  uchar *pubkeydata;
  char *passphrase_local;
  char *privatekey_local;
  char *publickey_local;
  size_t username_len_local;
  char *username_local;
  LIBSSH2_SESSION *session_local;
  
  pubkeydata_len = 0;
  privkey_file.passphrase = (char *)0x0;
  ppvStack_68 = &abstract;
  abstract = privatekey;
  privkey_file.filename = passphrase;
  pubkeydata = (uchar *)passphrase;
  passphrase_local = privatekey;
  privatekey_local = publickey;
  publickey_local = (char *)username_len;
  username_len_local = (size_t)username;
  username_local = (char *)session;
  if (session->userauth_pblc_state == libssh2_NB_state_idle) {
    if (publickey == (char *)0x0) {
      iVar1 = _libssh2_pub_priv_keyfile
                        (session,&session->userauth_pblc_method,&session->userauth_pblc_method_len,
                         (uchar **)&pubkeydata_len,(size_t *)&privkey_file.passphrase,privatekey,
                         passphrase);
    }
    else {
      iVar1 = file_read_publickey(session,&session->userauth_pblc_method,
                                  &session->userauth_pblc_method_len,(uchar **)&pubkeydata_len,
                                  (size_t *)&privkey_file.passphrase,publickey);
    }
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = _libssh2_userauth_publickey
                    ((LIBSSH2_SESSION *)username_local,(char *)username_len_local,
                     (uint)publickey_local,(uchar *)pubkeydata_len,
                     (unsigned_long)privkey_file.passphrase,sign_fromfile,&stack0xffffffffffffff98);
  if (pubkeydata_len != 0) {
    (**(code **)(username_local + 0x18))(pubkeydata_len,username_local);
  }
  return iVar1;
}

Assistant:

static int
userauth_publickey_fromfile(LIBSSH2_SESSION *session,
                            const char *username,
                            size_t username_len,
                            const char *publickey,
                            const char *privatekey,
                            const char *passphrase)
{
    unsigned char *pubkeydata = NULL;
    size_t pubkeydata_len = 0;
    struct privkey_file privkey_file;
    void *abstract = &privkey_file;
    int rc;

    privkey_file.filename = privatekey;
    privkey_file.passphrase = passphrase;

    if (session->userauth_pblc_state == libssh2_NB_state_idle) {
        if (publickey) {
            rc = file_read_publickey(session, &session->userauth_pblc_method,
                                     &session->userauth_pblc_method_len,
                                     &pubkeydata, &pubkeydata_len,publickey);
            if (rc)
                return rc;
        }
        else {
            /* Compute public key from private key. */
            rc = _libssh2_pub_priv_keyfile(session,
                                           &session->userauth_pblc_method,
                                           &session->userauth_pblc_method_len,
                                           &pubkeydata, &pubkeydata_len,
                                           privatekey, passphrase);

            /* _libssh2_pub_priv_keyfile calls _libssh2_error() */
            if (rc)
                return rc;
        }
    }

    rc = _libssh2_userauth_publickey(session, username, username_len,
                                     pubkeydata, pubkeydata_len,
                                     sign_fromfile, &abstract);
    if(pubkeydata)
        LIBSSH2_FREE(session, pubkeydata);

    return rc;
}